

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

fdb_compact_decision
cb_inmem_snap(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc_in,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_doc *pfVar8;
  fdb_iterator *doc_00;
  fdb_config *fconfig;
  fdb_config *pfVar9;
  size_t sVar10;
  fdb_kvs_handle *pfVar11;
  fdb_config *pfVar12;
  fdb_config *doc_01;
  char *__format;
  fdb_iterator *pfVar13;
  fdb_config *unaff_R12;
  fdb_doc *unaff_R13;
  long lVar14;
  ulong uVar15;
  fdb_kvs_handle *pfVar16;
  fdb_doc **doc_02;
  fdb_iterator *config;
  fdb_kvs_handle *snap;
  fdb_doc *doc;
  size_t valuelen;
  void *value_out;
  fdb_kvs_info info;
  timeval __test_begin;
  char value [256];
  char key [256];
  fdb_doc *pfStack_890;
  fdb_iterator *pfStack_888;
  int iStack_87c;
  fdb_kvs_handle *pfStack_878;
  timeval tStack_870;
  fdb_config *pfStack_860;
  fdb_config *pfStack_858;
  fdb_doc *pfStack_850;
  fdb_config *pfStack_848;
  fdb_iterator *pfStack_840;
  fdb_iterator *pfStack_838;
  fdb_kvs_handle *pfStack_828;
  fdb_config *pfStack_820;
  undefined1 auStack_818 [24];
  fdb_kvs_handle *pfStack_800;
  fdb_config *pfStack_7f8;
  fdb_kvs_handle *pfStack_7f0;
  fdb_kvs_handle *pfStack_7e8;
  undefined1 auStack_7e0 [80];
  undefined8 auStack_790 [5];
  fdb_doc *apfStack_768 [6];
  fdb_kvs_info fStack_738;
  timeval tStack_708;
  undefined1 auStack_6f8 [280];
  fdb_iterator fStack_5e0;
  fdb_config fStack_4e0;
  fdb_config fStack_3e0;
  fdb_kvs_handle *pfStack_2e8;
  fdb_config *pfStack_2e0;
  fdb_doc *pfStack_2d8;
  fdb_config *pfStack_2d0;
  fdb_kvs_handle *pfStack_2c8;
  code *pcStack_2c0;
  fdb_iterator *local_2b0;
  fdb_kvs_handle *local_2a8;
  fdb_doc *local_2a0;
  fdb_kvs_handle *local_298;
  fdb_kvs_handle *local_290;
  size_t local_288;
  fdb_kvs_handle *local_280;
  fdb_kvs_info local_278;
  undefined1 local_248 [14];
  undefined2 uStack_23a;
  fdb_config local_238;
  uint16_t local_138;
  undefined2 uStack_136;
  uint32_t uStack_134;
  
  uVar15 = (ulong)status;
  pfVar16 = (fdb_kvs_handle *)0x0;
  pcStack_2c0 = (code *)0x1136be;
  gettimeofday((timeval *)local_248,(__timezone_ptr_t)0x0);
  if (status != 2) goto LAB_00113b2b;
  if (kv_name == (char *)0x0) goto LAB_00113be0;
  pfVar16 = (fdb_kvs_handle *)(ulong)doc_in->deleted;
  iVar5 = *(int *)((long)ctx + 0xc);
  *(int *)((long)ctx + 0xc) = iVar5 + 1;
  unaff_R13 = (fdb_doc *)ctx;
  if (iVar5 != 4) {
    if (iVar5 != 1) goto LAB_00113b2b;
    pcStack_2c0 = (code *)0x11370e;
    fVar4 = fdb_snapshot_open(*ctx,&local_2a8,0xffffffffffffffff);
    pfVar11 = pfVar16;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113be5;
    pcStack_2c0 = (code *)0x113725;
    fVar4 = fdb_get_kvs_info(local_2a8,&local_278);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bef;
    doc_in = (fdb_doc *)((long)ctx + 8);
    if (local_278.last_seqnum != (long)*(int *)((long)ctx + 8)) {
      pcStack_2c0 = (code *)0x113b4e;
      cb_inmem_snap();
    }
    pcStack_2c0 = (code *)0x11376a;
    local_298 = pfVar16;
    local_290 = (fdb_kvs_handle *)doc_in;
    fVar4 = fdb_iterator_init(local_2a8,&local_2b0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      kv_name = local_248 + 10;
      uVar15 = 0;
      do {
        local_2a0 = (fdb_doc *)0x0;
        pcStack_2c0 = (code *)0x1137a1;
        fVar4 = fdb_iterator_get(local_2b0,&local_2a0);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pcStack_2c0 = (code *)0x1137c1;
        sprintf((char *)&stack0xfffffffffffffec8,*(char **)((long)ctx + 0x18),uVar15);
        sVar10 = (size_t)*(int *)((long)ctx + 0x10);
        pcStack_2c0 = (code *)0x1137d5;
        memset(&local_238,0x78,sVar10);
        builtin_strncpy((char *)((long)&((fdb_config *)kv_name)->chunksize + sVar10),"<end",4);
        *(undefined2 *)((long)&uStack_23a + sVar10) = 0x3e;
        pcStack_2c0 = (code *)0x1137f5;
        sprintf((char *)&local_238,*(char **)((long)ctx + 0x20),uVar15);
        unaff_R13 = local_2a0;
        doc_in = (fdb_doc *)local_2a0->key;
        pcStack_2c0 = (code *)0x11380d;
        iVar5 = bcmp(doc_in,&stack0xfffffffffffffec8,local_2a0->keylen);
        if (iVar5 != 0) {
          pcStack_2c0 = (code *)0x113b90;
          cb_inmem_snap();
LAB_00113b90:
          pcStack_2c0 = (code *)0x113ba0;
          cb_inmem_snap();
          goto LAB_00113ba0;
        }
        doc_in = (fdb_doc *)unaff_R13->body;
        pcStack_2c0 = (code *)0x113828;
        iVar5 = bcmp(doc_in,&local_238,unaff_R13->bodylen);
        if (iVar5 != 0) goto LAB_00113b90;
        uVar15 = (ulong)((int)uVar15 + 1);
        pcStack_2c0 = (code *)0x11383a;
        fdb_doc_free(unaff_R13);
        pcStack_2c0 = (code *)0x113844;
        fVar4 = fdb_iterator_next(local_2b0);
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)uVar15 != *(int *)&local_290->kvs_config) {
        pcStack_2c0 = (code *)0x113b6c;
        cb_inmem_snap();
      }
      pcStack_2c0 = (code *)0x113863;
      fVar4 = fdb_iterator_close(local_2b0);
      pfVar16 = local_298;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pcStack_2c0 = (code *)0x113875;
        cb_inmem_snap();
        goto LAB_00113875;
      }
LAB_00113b21:
      pcStack_2c0 = (code *)0x113b2b;
      fdb_kvs_close(local_2a8);
LAB_00113b2b:
      return (uint)pfVar16 & 0xff;
    }
    goto LAB_00113bf9;
  }
LAB_00113875:
  doc_in = (fdb_doc *)&stack0xfffffffffffffec8;
  local_138 = 0x656e;
  uStack_136 = 0x5f77;
  uStack_134 = 0x79656b;
  kv_name = (char *)&local_238;
  local_238.chunksize = 0x656e;
  local_238._2_2_ = 0x5f77;
  local_238.blocksize = 0x756c6176;
  local_238.buffercache_size._0_2_ = 0x65;
  pfVar11 = (fdb_kvs_handle *)unaff_R13->keylen;
  pcStack_2c0 = (code *)0x1138b7;
  local_298 = pfVar16;
  sVar10 = strlen((char *)doc_in);
  unaff_R12 = (fdb_config *)(sVar10 + 1);
  pcStack_2c0 = (code *)0x1138c3;
  sVar10 = strlen(kv_name);
  pcStack_2c0 = (code *)0x1138d8;
  fVar4 = fdb_set_kv(pfVar11,doc_in,(size_t)unaff_R12,kv_name,sVar10 + 1);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bea;
  pcStack_2c0 = (code *)0x1138f5;
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)unaff_R13->keylen,&local_2a8,0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bf4;
  pcStack_2c0 = (code *)0x11390c;
  fVar4 = fdb_get_kvs_info(local_2a8,&local_278);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113bfe;
  doc_in = (fdb_doc *)&unaff_R13->metalen;
  if (local_278.last_seqnum != (long)(int)unaff_R13->metalen + 1U) {
    pcStack_2c0 = (code *)0x113b60;
    cb_inmem_snap();
  }
  pcStack_2c0 = (code *)0x11394a;
  fVar4 = fdb_iterator_init(local_2a8,&local_2b0,(void *)0x0,0,(void *)0x0,0,0);
  pfVar8 = unaff_R13;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c03;
  unaff_R12 = &local_238;
  uVar15 = 0;
  do {
    local_2a0 = (fdb_doc *)0x0;
    pcStack_2c0 = (code *)0x11397c;
    fVar4 = fdb_iterator_get(local_2b0,&local_2a0);
    unaff_R13 = local_2a0;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    if ((int)uVar15 < (int)*(size_t *)doc_in) {
      pcStack_2c0 = (code *)0x1139a4;
      sprintf((char *)&stack0xfffffffffffffec8,*(char **)((long)ctx + 0x18),uVar15);
      sVar10 = (size_t)*(int *)((long)ctx + 0x10);
      pcStack_2c0 = (code *)0x1139b8;
      memset(unaff_R12,0x78,sVar10);
      *(undefined4 *)(local_248 + sVar10 + 10) = 0x646e653c;
      *(undefined2 *)((long)&uStack_23a + sVar10) = 0x3e;
      pcStack_2c0 = (code *)0x1139dd;
      sprintf((char *)unaff_R12,*(char **)((long)ctx + 0x20),uVar15);
      unaff_R13 = local_2a0;
      kv_name = (char *)local_2a0->key;
      pcStack_2c0 = (code *)0x1139f5;
      iVar5 = bcmp(kv_name,&stack0xfffffffffffffec8,local_2a0->keylen);
      if (iVar5 != 0) goto LAB_00113bb0;
      kv_name = (char *)unaff_R13->body;
      pcStack_2c0 = (code *)0x113a10;
      iVar5 = bcmp(kv_name,unaff_R12,unaff_R13->bodylen);
      if (iVar5 != 0) goto LAB_00113bc0;
    }
    else {
      local_138 = 0x656e;
      uStack_136 = 0x5f77;
      uStack_134 = 0x79656b;
      local_238.chunksize = 0x656e;
      local_238._2_2_ = 0x5f77;
      local_238.blocksize = 0x756c6176;
      local_238.buffercache_size._0_2_ = 0x65;
      kv_name = (char *)local_2a0->key;
      pcStack_2c0 = (code *)0x113a5f;
      iVar5 = bcmp(kv_name,&stack0xfffffffffffffec8,local_2a0->keylen);
      if (iVar5 != 0) goto LAB_00113bd0;
      kv_name = (char *)unaff_R13->body;
      pcStack_2c0 = (code *)0x113a7a;
      iVar5 = bcmp(kv_name,unaff_R12,unaff_R13->bodylen);
      if (iVar5 != 0) goto LAB_00113ba0;
    }
    uVar15 = (ulong)((int)uVar15 + 1);
    pcStack_2c0 = (code *)0x113a8c;
    fdb_doc_free(unaff_R13);
    pcStack_2c0 = (code *)0x113a96;
    fVar4 = fdb_iterator_next(local_2b0);
    pfVar8 = unaff_R13;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)uVar15 != (int)*(size_t *)doc_in + 1) {
    pcStack_2c0 = (code *)0x113b7b;
    cb_inmem_snap();
  }
  pcStack_2c0 = (code *)0x113ab4;
  fVar4 = fdb_iterator_close(local_2b0);
  pfVar16 = local_298;
  pfVar11 = local_2a8;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c08;
  kv_name = (char *)&stack0xfffffffffffffec8;
  pcStack_2c0 = (code *)0x113ad6;
  sVar10 = strlen(kv_name);
  pcStack_2c0 = (code *)0x113aef;
  fVar4 = fdb_get_kv(pfVar11,kv_name,sVar10 + 1,&local_280,&local_288);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113c0d;
  pcStack_2c0 = (code *)0x113b11;
  iVar5 = bcmp(local_280,&local_238,local_288);
  pfVar11 = local_280;
  if (iVar5 == 0) {
    pcStack_2c0 = (code *)0x113b21;
    fdb_free_block(local_280);
    goto LAB_00113b21;
  }
  goto LAB_00113c12;
LAB_00114672:
  pfStack_838 = (fdb_iterator *)0x11467d;
  snapshot_clone_test();
  pfVar9 = fconfig;
LAB_0011467d:
  fconfig = pfVar9;
  pfStack_838 = (fdb_iterator *)0x114682;
  snapshot_clone_test();
LAB_00114682:
  pfStack_838 = (fdb_iterator *)0x11468d;
  snapshot_clone_test();
LAB_0011468d:
  pfVar12 = (fdb_config *)&pfStack_820;
  pfStack_838 = (fdb_iterator *)0x114698;
  snapshot_clone_test();
  goto LAB_00114698;
LAB_00113ba0:
  pcStack_2c0 = (code *)0x113bb0;
  cb_inmem_snap();
LAB_00113bb0:
  pcStack_2c0 = (code *)0x113bc0;
  cb_inmem_snap();
LAB_00113bc0:
  pcStack_2c0 = (code *)0x113bd0;
  cb_inmem_snap();
LAB_00113bd0:
  pfVar16 = (fdb_kvs_handle *)&stack0xfffffffffffffec8;
  unaff_R12 = &local_238;
  pcStack_2c0 = (code *)0x113be0;
  cb_inmem_snap();
LAB_00113be0:
  pcStack_2c0 = (code *)0x113be5;
  cb_inmem_snap();
  pfVar11 = pfVar16;
LAB_00113be5:
  pcStack_2c0 = (code *)0x113bea;
  cb_inmem_snap();
LAB_00113bea:
  pcStack_2c0 = (code *)0x113bef;
  cb_inmem_snap();
LAB_00113bef:
  pcStack_2c0 = (code *)0x113bf4;
  cb_inmem_snap();
LAB_00113bf4:
  pcStack_2c0 = (code *)0x113bf9;
  cb_inmem_snap();
LAB_00113bf9:
  pcStack_2c0 = (code *)0x113bfe;
  cb_inmem_snap();
LAB_00113bfe:
  pcStack_2c0 = (code *)0x113c03;
  cb_inmem_snap();
  pfVar8 = unaff_R13;
LAB_00113c03:
  pcStack_2c0 = (code *)0x113c08;
  cb_inmem_snap();
  pfVar16 = pfVar11;
LAB_00113c08:
  pfVar11 = (fdb_kvs_handle *)doc_in;
  pcStack_2c0 = (code *)0x113c0d;
  cb_inmem_snap();
LAB_00113c0d:
  pcStack_2c0 = (code *)0x113c12;
  cb_inmem_snap();
LAB_00113c12:
  pcStack_2c0 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_838 = (fdb_iterator *)0x113c42;
  pfStack_2e8 = pfVar11;
  pfStack_2e0 = unaff_R12;
  pfStack_2d8 = pfVar8;
  pfStack_2d0 = (fdb_config *)kv_name;
  pfStack_2c8 = pfVar16;
  pcStack_2c0 = (code *)uVar15;
  gettimeofday(&tStack_708,(__timezone_ptr_t)0x0);
  pfStack_838 = (fdb_iterator *)0x113c47;
  memleak_start();
  pfStack_838 = (fdb_iterator *)0x113c56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &fStack_3e0;
  pfStack_838 = (fdb_iterator *)0x113c66;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_6f8;
  pfStack_838 = (fdb_iterator *)0x113c76;
  fdb_get_default_kvs_config();
  fStack_3e0.buffercache_size = 0;
  fStack_3e0.wal_threshold = 0x400;
  fStack_3e0.seqtree_opt = '\x01';
  fStack_3e0.flags = 1;
  fStack_3e0.compaction_threshold = '\0';
  pfStack_838 = (fdb_iterator *)0x113ca0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar12 = (fdb_config *)(auStack_818 + 0x10);
  pfStack_838 = (fdb_iterator *)0x113cb7;
  fVar4 = fdb_open((fdb_file_handle **)pfVar12,"./mvcc_test1",fconfig);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_838 = (fdb_iterator *)0x113cc9;
  fdb_kvs_open_default((fdb_file_handle *)auStack_818._16_8_,&pfStack_828,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_838 = (fdb_iterator *)0x113ce2;
    fVar4 = fdb_snapshot_open(pfStack_828,(fdb_kvs_handle **)(auStack_818 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011469d;
    pfStack_838 = (fdb_iterator *)0x113cfc;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_818._8_8_,&fStack_738);
    if ((fdb_config *)fStack_738.last_seqnum != (fdb_config *)0x0) {
      pfStack_838 = (fdb_iterator *)0x113d0f;
      snapshot_clone_test();
    }
    pfVar12 = (fdb_config *)auStack_818;
    pfStack_838 = (fdb_iterator *)0x113d32;
    fdb_iterator_init((fdb_kvs_handle *)auStack_818._8_8_,(fdb_iterator **)pfVar12,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_838 = (fdb_iterator *)0x113d3a;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_818._0_8_);
    pfVar9 = unaff_R12;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_001146a2;
    pfStack_838 = (fdb_iterator *)0x113d4d;
    fdb_iterator_close((fdb_iterator *)auStack_818._0_8_);
    pfStack_838 = (fdb_iterator *)0x113d57;
    fdb_kvs_close((fdb_kvs_handle *)auStack_818._8_8_);
    lVar14 = 0;
    uVar15 = 0;
    do {
      pfStack_838 = (fdb_iterator *)0x113d79;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113d95;
      sprintf((char *)&fStack_5e0,"meta%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113db1;
      sprintf((char *)&fStack_4e0,"body%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113dc1;
      sVar10 = strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x113dcc;
      sVar6 = strlen((char *)&fStack_5e0);
      pfStack_838 = (fdb_iterator *)0x113dd7;
      sVar7 = strlen((char *)&fStack_4e0);
      pfStack_838 = (fdb_iterator *)0x113dfc;
      fdb_doc_create((fdb_doc **)(auStack_7e0 + lVar14),auStack_6f8 + 0x18,sVar10,&fStack_5e0,sVar6,
                     &fStack_4e0,sVar7);
      pfStack_838 = (fdb_iterator *)0x113e0b;
      fdb_set(pfStack_828,*(fdb_doc **)(auStack_7e0 + uVar15 * 8));
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 8;
    } while (uVar15 != 5);
    pfStack_838 = (fdb_iterator *)0x113e2b;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\x01');
    uVar15 = 5;
    doc_02 = (fdb_doc **)(auStack_7e0 + 0x28);
    do {
      pfStack_838 = (fdb_iterator *)0x113e52;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113e6e;
      sprintf((char *)&fStack_5e0,"meta%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113e8a;
      sprintf((char *)&fStack_4e0,"body%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113e92;
      sVar10 = strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x113e9d;
      sVar6 = strlen((char *)&fStack_5e0);
      pfStack_838 = (fdb_iterator *)0x113ea8;
      sVar7 = strlen((char *)&fStack_4e0);
      pfStack_838 = (fdb_iterator *)0x113ec8;
      fdb_doc_create(doc_02,auStack_6f8 + 0x18,sVar10,&fStack_5e0,sVar6,&fStack_4e0,sVar7);
      pfStack_838 = (fdb_iterator *)0x113ed5;
      fdb_set(pfStack_828,*doc_02);
      uVar15 = uVar15 + 1;
      doc_02 = doc_02 + 1;
    } while (uVar15 != 9);
    fconfig = (fdb_config *)(auStack_6f8 + 0x18);
    pfStack_838 = (fdb_iterator *)0x113f04;
    sprintf((char *)fconfig,"key%d",9);
    config = &fStack_5e0;
    pfStack_838 = (fdb_iterator *)0x113f22;
    sprintf((char *)config,"meta%d",9);
    pfVar9 = &fStack_4e0;
    pfStack_838 = (fdb_iterator *)0x113f40;
    sprintf((char *)pfVar9,"Body%d",9);
    pfVar12 = (fdb_config *)(auStack_7e0 + 0x48);
    pfStack_838 = (fdb_iterator *)0x113f50;
    pfVar8 = (fdb_doc *)strlen((char *)fconfig);
    pfStack_838 = (fdb_iterator *)0x113f5b;
    doc_00 = (fdb_iterator *)strlen((char *)config);
    pfStack_838 = (fdb_iterator *)0x113f66;
    sVar10 = strlen((char *)pfVar9);
    pfStack_838 = (fdb_iterator *)0x113f81;
    fdb_doc_create((fdb_doc **)pfVar12,fconfig,(size_t)pfVar8,config,(size_t)doc_00,pfVar9,sVar10);
    pfStack_838 = (fdb_iterator *)0x113f8e;
    fdb_set(pfStack_828,(fdb_doc *)auStack_7e0._72_8_);
    pfStack_838 = (fdb_iterator *)0x113f9a;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    **(undefined1 **)(auStack_7e0._72_8_ + 0x40) = 0x62;
    pfStack_838 = (fdb_iterator *)0x113fb1;
    fdb_set(pfStack_828,(fdb_doc *)auStack_7e0._72_8_);
    pfStack_838 = (fdb_iterator *)0x113fbd;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    pfStack_7f8 = *(fdb_config **)(auStack_7e0._72_8_ + 0x28);
    pfStack_838 = (fdb_iterator *)0x113fdf;
    fVar4 = fdb_snapshot_open(pfStack_828,&pfStack_7e8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146a7;
    pfStack_838 = (fdb_iterator *)0x113ff9;
    fdb_set(pfStack_828,(fdb_doc *)auStack_7e0._72_8_);
    pfStack_838 = (fdb_iterator *)0x114005;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    uVar15 = 10;
    pfVar12 = (fdb_config *)0x50;
    do {
      pfStack_838 = (fdb_iterator *)0x11402c;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x114048;
      sprintf((char *)&fStack_5e0,"meta%d",uVar15 & 0xffffffff);
      pfVar9 = &fStack_4e0;
      pfStack_838 = (fdb_iterator *)0x114064;
      sprintf((char *)pfVar9,"body%d",uVar15 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_7e0 + (long)pfVar12);
      pfStack_838 = (fdb_iterator *)0x114074;
      fconfig = (fdb_config *)strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x11407f;
      pfVar8 = (fdb_doc *)strlen((char *)&fStack_5e0);
      pfStack_838 = (fdb_iterator *)0x11408a;
      sVar10 = strlen((char *)pfVar9);
      pfStack_838 = (fdb_iterator *)0x1140af;
      fdb_doc_create((fdb_doc **)doc_00,auStack_6f8 + 0x18,(size_t)fconfig,&fStack_5e0,
                     (size_t)pfVar8,pfVar9,sVar10);
      pfStack_838 = (fdb_iterator *)0x1140be;
      fdb_set(pfStack_828,*(fdb_doc **)(auStack_7e0 + uVar15 * 8));
      uVar15 = uVar15 + 1;
      pfVar12 = (fdb_config *)((long)pfVar12 + 8);
    } while (uVar15 != 0xf);
    pfStack_838 = (fdb_iterator *)0x1140de;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\x01');
    pfStack_838 = (fdb_iterator *)0x1140f6;
    fVar4 = fdb_set_log_callback(pfStack_828,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ac;
    pfStack_838 = (fdb_iterator *)0x114112;
    fVar4 = fdb_snapshot_open(pfStack_828,(fdb_kvs_handle **)(auStack_818 + 8),999999);
    fconfig = pfStack_7f8;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001146b1;
    pfStack_838 = (fdb_iterator *)0x114132;
    fVar4 = fdb_snapshot_open(pfStack_828,(fdb_kvs_handle **)(auStack_818 + 8),
                              (fdb_seqnum_t)pfStack_7f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146b6;
    pfStack_838 = (fdb_iterator *)0x11414c;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_818._8_8_,&pfStack_800,(fdb_seqnum_t)fconfig
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146bb;
    pfStack_838 = (fdb_iterator *)0x11415e;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_818._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c0;
    pfStack_838 = (fdb_iterator *)0x11417b;
    fdb_get_kvs_info(pfStack_800,&fStack_738);
    if ((fdb_config *)fStack_738.last_seqnum != fconfig) {
      pfStack_838 = (fdb_iterator *)0x114191;
      snapshot_clone_test();
    }
    uVar15 = 0xf;
    config = (fdb_iterator *)apfStack_768;
    do {
      pfStack_838 = (fdb_iterator *)0x1141b9;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar15 & 0xffffffff);
      doc_00 = &fStack_5e0;
      pfStack_838 = (fdb_iterator *)0x1141d4;
      sprintf((char *)doc_00,"meta%d",uVar15 & 0xffffffff);
      fconfig = &fStack_4e0;
      pfStack_838 = (fdb_iterator *)0x1141ef;
      sprintf((char *)fconfig,"body%d",uVar15 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x1141f7;
      pfVar9 = (fdb_config *)strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x114202;
      pfVar8 = (fdb_doc *)strlen((char *)doc_00);
      pfStack_838 = (fdb_iterator *)0x11420d;
      sVar10 = strlen((char *)fconfig);
      pfStack_838 = (fdb_iterator *)0x11422d;
      fdb_doc_create((fdb_doc **)config,auStack_6f8 + 0x18,(size_t)pfVar9,doc_00,(size_t)pfVar8,
                     fconfig,sVar10);
      pfStack_838 = (fdb_iterator *)0x11423a;
      fdb_set(pfStack_828,*(fdb_doc **)config);
      uVar15 = uVar15 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar15 != 0x14);
    pfStack_838 = (fdb_iterator *)0x114257;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    pfStack_838 = (fdb_iterator *)0x11426d;
    fVar4 = fdb_snapshot_open(pfStack_7e8,&pfStack_7f0,0xffffffffffffffff);
    pfVar12 = (fdb_config *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146c5;
    pfVar12 = (fdb_config *)&pfStack_820;
    pfStack_838 = (fdb_iterator *)0x1142b8;
    fdb_doc_create((fdb_doc **)pfVar12,
                   (void *)(*(size_t **)
                             (auStack_7e0 + (((long)pfStack_7f8 << 0x20) + 0x100000000 >> 0x1d)))[4]
                   ,**(size_t **)(auStack_7e0 + (((long)pfStack_7f8 << 0x20) + 0x100000000 >> 0x1d))
                   ,(void *)0x0,0,(void *)0x0,0);
    pfStack_838 = (fdb_iterator *)0x1142c5;
    fVar4 = fdb_get_metaonly(pfStack_800,(fdb_doc *)pfStack_820);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001146ca;
    pfStack_838 = (fdb_iterator *)0x1142db;
    fdb_doc_free((fdb_doc *)pfStack_820);
    pfStack_838 = (fdb_iterator *)0x1142ff;
    fdb_doc_create((fdb_doc **)&pfStack_820,*(void **)(auStack_7e0._40_8_ + 0x20),
                   *(size_t *)(uint16_t *)auStack_7e0._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_838 = (fdb_iterator *)0x11430c;
    fVar4 = fdb_get_metaonly(pfStack_800,(fdb_doc *)pfStack_820);
    unaff_R12 = (fdb_config *)auStack_7e0._40_8_;
    doc_01 = pfStack_820;
    pfVar12 = (fdb_config *)&pfStack_820;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146cf;
    fconfig = *(fdb_config **)&pfStack_820->seqtree_opt;
    config = *(fdb_iterator **)(auStack_7e0._40_8_ + 0x20);
    pfStack_838 = (fdb_iterator *)0x114336;
    iVar5 = bcmp(fconfig,config,*(size_t *)(uint16_t *)auStack_7e0._40_8_);
    if (iVar5 != 0) goto LAB_001146d4;
    fconfig = (fdb_config *)doc_01->compactor_sleep_duration;
    config = *(fdb_iterator **)((long)unaff_R12 + 0x38);
    pfStack_838 = (fdb_iterator *)0x114357;
    iVar5 = bcmp(fconfig,config,*(uint64_t *)((long)unaff_R12 + 8));
    if (iVar5 != 0) goto LAB_001146df;
    pfStack_838 = (fdb_iterator *)0x114367;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_838 = (fdb_iterator *)0x114388;
    fdb_doc_create((fdb_doc **)&pfStack_820,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_820->compaction_buf_maxsize = 6;
    pfStack_820->cleanup_cache_onclose = false;
    pfStack_820->compress_document_body = false;
    pfStack_820->compaction_mode = '\0';
    pfStack_820->compaction_threshold = '\0';
    pfStack_838 = (fdb_iterator *)0x11439d;
    fVar4 = fdb_get_byseq(pfStack_800,(fdb_doc *)pfStack_820);
    pfVar12 = pfStack_820;
    doc_01 = (fdb_config *)&pfStack_820;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001146ea;
    sVar10._0_2_ = pfStack_820->chunksize;
    sVar10._2_2_ = *(undefined2 *)&pfStack_820->field_0x2;
    sVar10._4_4_ = pfStack_820->blocksize;
    fconfig = *(fdb_config **)&pfStack_820->seqtree_opt;
    config = *(fdb_iterator **)(auStack_7e0._40_8_ + 0x20);
    pfStack_838 = (fdb_iterator *)0x1143c6;
    iVar5 = bcmp(fconfig,config,sVar10);
    unaff_R12 = (fdb_config *)auStack_7e0._40_8_;
    if (iVar5 != 0) goto LAB_001146ef;
    fconfig = *(fdb_config **)&pfVar12->multi_kv_instances;
    config = *(fdb_iterator **)(auStack_7e0._40_8_ + 0x40);
    pfStack_838 = (fdb_iterator *)0x1143e6;
    iVar5 = bcmp(fconfig,config,pfVar12->wal_threshold);
    if (iVar5 != 0) goto LAB_001146fa;
    pfStack_838 = (fdb_iterator *)0x1143f6;
    fdb_doc_free((fdb_doc *)pfVar12);
    pfVar12 = (fdb_config *)&pfStack_820;
    pfStack_820 = (fdb_config *)0x0;
    pfVar8 = (fdb_doc *)0x0;
    pfStack_838 = (fdb_iterator *)0x114425;
    fdb_iterator_init(pfStack_800,(fdb_iterator **)auStack_818,(void *)0x0,0,(void *)0x0,0,0);
    pfVar9 = fconfig;
    do {
      pfStack_838 = (fdb_iterator *)0x114432;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_818._0_8_,(fdb_doc **)pfVar12);
      fconfig = pfStack_820;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_00114657:
        pfStack_838 = (fdb_iterator *)0x11465c;
        snapshot_clone_test();
        fconfig = pfVar9;
LAB_0011465c:
        pfStack_838 = (fdb_iterator *)0x114667;
        snapshot_clone_test();
LAB_00114667:
        pfStack_838 = (fdb_iterator *)0x114672;
        snapshot_clone_test();
        goto LAB_00114672;
      }
      sVar6._0_2_ = pfStack_820->chunksize;
      sVar6._2_2_ = *(undefined2 *)&pfStack_820->field_0x2;
      sVar6._4_4_ = pfStack_820->blocksize;
      config = *(fdb_iterator **)&pfStack_820->seqtree_opt;
      doc_00 = *(fdb_iterator **)(auStack_7e0 + (long)pfVar8 * 8);
      unaff_R12 = (fdb_config *)doc_00->_seqnum;
      pfStack_838 = (fdb_iterator *)0x11445a;
      iVar5 = bcmp(config,unaff_R12,sVar6);
      pfVar9 = fconfig;
      if (iVar5 != 0) {
        pfStack_838 = (fdb_iterator *)0x114657;
        snapshot_clone_test();
        goto LAB_00114657;
      }
      config = (fdb_iterator *)fconfig->compactor_sleep_duration;
      unaff_R12 = (fdb_config *)doc_00->tree_cursor_start;
      pfStack_838 = (fdb_iterator *)0x114479;
      iVar5 = bcmp(config,unaff_R12,fconfig->buffercache_size);
      if (iVar5 != 0) goto LAB_00114667;
      config = *(fdb_iterator **)&fconfig->multi_kv_instances;
      unaff_R12 = (fdb_config *)doc_00->tree_cursor_prev;
      pfStack_838 = (fdb_iterator *)0x114498;
      iVar5 = bcmp(config,unaff_R12,fconfig->wal_threshold);
      if (iVar5 != 0) goto LAB_0011465c;
      pfStack_838 = (fdb_iterator *)0x1144a8;
      fdb_doc_free((fdb_doc *)fconfig);
      pfStack_820 = (fdb_config *)0x0;
      pfVar8 = (fdb_doc *)((long)&pfVar8->keylen + 1);
      pfStack_838 = (fdb_iterator *)0x1144be;
      pfVar13 = (fdb_iterator *)auStack_818._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_818._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)pfVar8 == 10) {
      pfStack_838 = (fdb_iterator *)0x1144dd;
      fdb_iterator_close((fdb_iterator *)auStack_818._0_8_);
      pfVar8 = (fdb_doc *)0x0;
      pfStack_838 = (fdb_iterator *)0x1144fe;
      fdb_iterator_init(pfStack_7f0,(fdb_iterator **)auStack_818,(void *)0x0,0,(void *)0x0,0,0);
      pfVar12 = (fdb_config *)&pfStack_820;
      do {
        pfStack_838 = (fdb_iterator *)0x114510;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_818._0_8_,(fdb_doc **)pfVar12);
        fconfig = pfStack_820;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011467d;
        sVar7._0_2_ = pfStack_820->chunksize;
        sVar7._2_2_ = *(undefined2 *)&pfStack_820->field_0x2;
        sVar7._4_4_ = pfStack_820->blocksize;
        config = *(fdb_iterator **)&pfStack_820->seqtree_opt;
        doc_00 = *(fdb_iterator **)(auStack_7e0 + (long)pfVar8 * 8);
        unaff_R12 = (fdb_config *)doc_00->_seqnum;
        pfStack_838 = (fdb_iterator *)0x114538;
        iVar5 = bcmp(config,unaff_R12,sVar7);
        if (iVar5 != 0) goto LAB_00114672;
        config = (fdb_iterator *)fconfig->compactor_sleep_duration;
        unaff_R12 = (fdb_config *)doc_00->tree_cursor_start;
        pfStack_838 = (fdb_iterator *)0x114557;
        iVar5 = bcmp(config,unaff_R12,fconfig->buffercache_size);
        if (iVar5 != 0) goto LAB_0011468d;
        config = *(fdb_iterator **)&fconfig->multi_kv_instances;
        unaff_R12 = (fdb_config *)doc_00->tree_cursor_prev;
        pfStack_838 = (fdb_iterator *)0x114576;
        iVar5 = bcmp(config,unaff_R12,fconfig->wal_threshold);
        if (iVar5 != 0) goto LAB_00114682;
        pfStack_838 = (fdb_iterator *)0x114586;
        fdb_doc_free((fdb_doc *)fconfig);
        pfStack_820 = (fdb_config *)0x0;
        pfVar8 = (fdb_doc *)((long)&pfVar8->keylen + 1);
        pfStack_838 = (fdb_iterator *)0x11459c;
        pfVar13 = (fdb_iterator *)auStack_818._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_818._0_8_);
        pfVar9 = fconfig;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)pfVar8 == 10) {
        pfStack_838 = (fdb_iterator *)0x1145b8;
        fdb_iterator_close((fdb_iterator *)auStack_818._0_8_);
        pfStack_838 = (fdb_iterator *)0x1145c2;
        fdb_kvs_close(pfStack_828);
        pfStack_838 = (fdb_iterator *)0x1145cc;
        fdb_kvs_close(pfStack_7e8);
        pfStack_838 = (fdb_iterator *)0x1145d6;
        fdb_kvs_close(pfStack_7f0);
        pfStack_838 = (fdb_iterator *)0x1145e0;
        fdb_kvs_close(pfStack_800);
        pfStack_838 = (fdb_iterator *)0x1145ea;
        fdb_close((fdb_file_handle *)auStack_818._16_8_);
        lVar14 = 0;
        do {
          pfStack_838 = (fdb_iterator *)0x1145f6;
          fdb_doc_free(*(fdb_doc **)(auStack_7e0 + lVar14 * 8));
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0x14);
        pfStack_838 = (fdb_iterator *)0x114604;
        fdb_shutdown();
        pfStack_838 = (fdb_iterator *)0x114609;
        memleak_end();
        __format = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        pfStack_838 = (fdb_iterator *)0x11463a;
        iVar5 = fprintf(_stderr,__format,"snapshot clone test");
        return iVar5;
      }
      goto LAB_0011470a;
    }
  }
  else {
LAB_00114698:
    pfStack_838 = (fdb_iterator *)0x11469d;
    snapshot_clone_test();
LAB_0011469d:
    pfStack_838 = (fdb_iterator *)0x1146a2;
    snapshot_clone_test();
    pfVar9 = unaff_R12;
LAB_001146a2:
    pfStack_838 = (fdb_iterator *)0x1146a7;
    snapshot_clone_test();
LAB_001146a7:
    pfStack_838 = (fdb_iterator *)0x1146ac;
    snapshot_clone_test();
LAB_001146ac:
    pfStack_838 = (fdb_iterator *)0x1146b1;
    snapshot_clone_test();
LAB_001146b1:
    pfStack_838 = (fdb_iterator *)0x1146b6;
    snapshot_clone_test();
LAB_001146b6:
    pfStack_838 = (fdb_iterator *)0x1146bb;
    snapshot_clone_test();
LAB_001146bb:
    pfStack_838 = (fdb_iterator *)0x1146c0;
    snapshot_clone_test();
LAB_001146c0:
    pfStack_838 = (fdb_iterator *)0x1146c5;
    snapshot_clone_test();
LAB_001146c5:
    pfStack_838 = (fdb_iterator *)0x1146ca;
    snapshot_clone_test();
LAB_001146ca:
    pfStack_838 = (fdb_iterator *)0x1146cf;
    snapshot_clone_test();
LAB_001146cf:
    unaff_R12 = pfVar9;
    doc_01 = pfVar12;
    pfStack_838 = (fdb_iterator *)0x1146d4;
    snapshot_clone_test();
LAB_001146d4:
    pfStack_838 = (fdb_iterator *)0x1146df;
    snapshot_clone_test();
LAB_001146df:
    pfStack_838 = (fdb_iterator *)0x1146ea;
    snapshot_clone_test();
LAB_001146ea:
    pfVar12 = doc_01;
    pfStack_838 = (fdb_iterator *)0x1146ef;
    snapshot_clone_test();
LAB_001146ef:
    pfStack_838 = (fdb_iterator *)0x1146fa;
    snapshot_clone_test();
LAB_001146fa:
    pfStack_838 = (fdb_iterator *)0x114705;
    pfVar13 = config;
    snapshot_clone_test();
  }
  pfStack_838 = (fdb_iterator *)0x11470a;
  snapshot_clone_test();
LAB_0011470a:
  pfStack_838 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_890 = (fdb_doc *)0x0;
  pfVar16 = pfVar13->handle;
  iVar5 = *(int *)&pfVar13->seqtree_iterator;
  pfStack_860 = pfVar12;
  pfStack_858 = unaff_R12;
  pfStack_850 = pfVar8;
  pfStack_848 = fconfig;
  pfStack_840 = config;
  pfStack_838 = doc_00;
  gettimeofday(&tStack_870,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar13->hbtrie_iterator,&pfStack_878,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar14 = 0;
  iStack_87c = iVar5;
  fdb_iterator_init(pfStack_878,&pfStack_888,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_888,&pfStack_890);
    pfVar8 = pfStack_890;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_890->key;
    lVar2 = *(long *)(&(pfVar16->kvs_config).create_if_missing + lVar14 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_890->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfVar8->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,pfVar8->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(pfVar8);
    pfStack_890 = (fdb_doc *)0x0;
    lVar14 = lVar14 + 1;
    fVar4 = fdb_iterator_next(pfStack_888);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_87c / 2 != (int)lVar14) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7e9);
    __assert_fail("count==n/2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7e9,"void *snap_clone_thread(void *)");
  }
  fdb_iterator_close(pfStack_888);
  fdb_kvs_close(pfStack_878);
  pthread_exit((void *)0x0);
}

Assistant:

static fdb_compact_decision cb_inmem_snap(fdb_file_handle *fhandle,
                            fdb_compaction_status status,
                            const char *kv_name,
                            fdb_doc *doc_in, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    int c, idx;
    char key[256], value[256];
    void *value_out;
    size_t valuelen;
    fdb_kvs_handle *snap;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_inmem_snap_args *args = (struct cb_inmem_snap_args *)ctx;
    (void)args;

    if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(kv_name);
        if (doc_in->deleted) {
            ret = FDB_CS_DROP_DOC;
        }
        args->move_count++;
        if (args->move_count == 2) {
            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                idx = c;
                sprintf(key, args->keystr, idx);
                memset(value, 'x', args->value_len);
                memcpy(value + args->value_len - 6, "<end>", 6);
                sprintf(value, args->valuestr, idx);
                TEST_CMP(doc->key, key, doc->keylen);
                TEST_CMP(doc->body, value, doc->bodylen);

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            fdb_kvs_close(snap);

        } else if (args->move_count == 5) {
            // insert new doc
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            s = fdb_set_kv(args->handle, (void*)key, strlen(key)+1, (void*)value, strlen(value)+1);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n+1);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                if (c < args->n) {
                    idx = c;
                    sprintf(key, args->keystr, idx);
                    memset(value, 'x', args->value_len);
                    memcpy(value + args->value_len - 6, "<end>", 6);
                    sprintf(value, args->valuestr, idx);
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                } else {
                    // new document
                    sprintf(key, "new_key");
                    sprintf(value, "new_value");
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                }

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n + 1);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CMP(value_out, value, valuelen);
            fdb_free_block(value_out);

            fdb_kvs_close(snap);
        }
    }
    return ret;
}